

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Stack.h
# Opt level: O3

void __thiscall w3Stack::DumpStack(w3Stack *this,PCSTR prefix)

{
  pointer pwVar1;
  pointer pwVar2;
  PCSTR pcVar3;
  long lVar4;
  long lVar5;
  
  pwVar1 = (this->super_w3StackBase).super_w3StackBaseBase.
           super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pwVar2 = (this->super_w3StackBase).super_w3StackBaseBase.
           super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = ((long)pwVar1 - (long)pwVar2 >> 4) * -0x5555555555555555;
  printf("stack@%s: %lX ",prefix,lVar5);
  if (pwVar1 != pwVar2) {
    lVar4 = 0;
    do {
      pcVar3 = TagToString((uint)*(byte *)((long)&((this->super_w3StackBase).super_w3StackBaseBase.
                                                                                                      
                                                  super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->tag +
                                          lVar4));
      printf("%s:",pcVar3);
      putchar(0x20);
      lVar4 = lVar4 + 0x30;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  putchar(10);
  return;
}

Assistant:

void DumpStack (PCSTR prefix)
    {
        const size_t n = size ();
        printf ("stack@%s: %" FORMAT_SIZE "X ", prefix, n);
        for (size_t i = 0; i != n; ++i)
        {
            printf ("%s:", TagToString (begin () [(ssize_t)i].tag));
            switch (begin () [(ssize_t)i].tag)
            {
            case Tag_Label:
                break;
            case Tag_Frame:
                break;
            case Tag_Value:
                printf ("%s", TagToString (begin () [(ssize_t)i].value.tag));
                break;
            default:; //todo
            }
            printf (" ");
        }
        printf ("\n");
    }